

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc4.c
# Opt level: O1

int mbedtls_arc4_self_test(int verbose)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  uchar ibuf [8];
  uchar obuf [8];
  mbedtls_arc4_context ctx;
  undefined8 local_148;
  long local_140;
  mbedtls_arc4_context local_138;
  
  memset(&local_138,0,0x108);
  uVar2 = 1;
  lVar3 = 0;
  do {
    if (verbose != 0) {
      printf("  ARC4 test #%d: ",uVar2);
    }
    local_148 = *(undefined8 *)(arc4_test_pt[0] + lVar3);
    mbedtls_arc4_setup(&local_138,arc4_test_key[0] + lVar3,8);
    mbedtls_arc4_crypt(&local_138,8,(uchar *)&local_148,(uchar *)&local_140);
    if (local_140 != *(long *)(arc4_test_ct[0] + lVar3)) {
      iVar1 = 1;
      if (verbose != 0) {
        puts("failed");
      }
      goto LAB_0012fed3;
    }
    if (verbose != 0) {
      puts("passed");
    }
    uVar2 = (ulong)((int)uVar2 + 1);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  iVar1 = 0;
  if (verbose != 0) {
    putchar(10);
    iVar1 = 0;
  }
LAB_0012fed3:
  mbedtls_platform_zeroize(&local_138,0x108);
  return iVar1;
}

Assistant:

int mbedtls_arc4_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char ibuf[8];
    unsigned char obuf[8];
    mbedtls_arc4_context ctx;

    mbedtls_arc4_init( &ctx );

    for( i = 0; i < 3; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ARC4 test #%d: ", i + 1 );

        memcpy( ibuf, arc4_test_pt[i], 8 );

        mbedtls_arc4_setup( &ctx, arc4_test_key[i], 8 );
        mbedtls_arc4_crypt( &ctx, 8, ibuf, obuf );

        if( memcmp( obuf, arc4_test_ct[i], 8 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_arc4_free( &ctx );

    return( ret );
}